

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Parser<UTF8EncodingPolicyBase<false>,_false>::AlternativePass0
          (Parser<UTF8EncodingPolicyBase<false>,_false> *this,int depth)

{
  EncodedChar EVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  EncodedChar *pEVar5;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    pEVar5 = this->next;
    if (this->inputLim < pEVar5) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
      pEVar5 = this->next;
    }
    EVar1 = *pEVar5;
    if (EVar1 == '\0') {
      if (this->inputLim <= pEVar5) {
        return;
      }
    }
    else {
      if (EVar1 == ')') {
        return;
      }
      if (EVar1 == '|') {
        return;
      }
    }
    TermPass0(this,depth);
  } while( true );
}

Assistant:

void Parser<P, IsLiteral>::AlternativePass0(int depth)
    {
        while (!IsEndOfAlternative())
            TermPass0(depth);
    }